

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::UniformBlockMemberAlignNonPowerOf2Test::testInit
          (UniformBlockMemberAlignNonPowerOf2Test *this)

{
  bool bVar1;
  int iVar2;
  Type TVar3;
  undefined1 local_74 [8];
  testCase test_case;
  GLuint stage_1;
  bool should_fail;
  undefined8 uStack_50;
  GLuint align;
  GLuint local_48;
  undefined8 local_3c;
  GLuint local_34;
  undefined8 *local_30;
  Type *type;
  uint local_20;
  GLuint j;
  GLuint stage;
  undefined1 auStack_14 [2];
  bool stage_support [6];
  GLuint n_types;
  UniformBlockMemberAlignNonPowerOf2Test *this_local;
  
  unique0x10000134 = this;
  _auStack_14 = TestBase::getTypesNumber((TestBase *)this);
  for (local_20 = 0; local_20 < 6; local_20 = local_20 + 1) {
    iVar2 = (*(this->super_NegativeTestBase).super_TestBase.super_TestCase.super_TestCase.
              super_TestNode._vptr_TestNode[0xc])(this,(ulong)local_20);
    *(byte *)((long)&j + (ulong)local_20 + 2) = (byte)iVar2 & 1;
  }
  for (type._4_4_ = 0; type._4_4_ < _auStack_14; type._4_4_ = type._4_4_ + 1) {
    TVar3 = TestBase::getType((TestBase *)this,type._4_4_);
    uStack_50 = TVar3._0_8_;
    local_3c = uStack_50;
    local_48 = TVar3.m_n_rows;
    local_34 = local_48;
    local_30 = &local_3c;
    for (stage_1 = 0; stage_1 < 0x81; stage_1 = stage_1 + 1) {
      bVar1 = isPowerOf2(this,stage_1);
      test_case.m_stage._3_1_ = (bVar1 ^ 0xff) & 1;
      test_case.m_should_fail = false;
      test_case._17_3_ = 0;
      for (; (uint)test_case._16_4_ < 6; test_case._16_4_ = test_case._16_4_ + 1) {
        if ((*(byte *)((long)&j + (ulong)(uint)test_case._16_4_ + 2) & 1) != 0) {
          local_74._0_4_ = stage_1;
          unique0x00012000 = *local_30;
          test_case.m_type.m_basic_type = *(TYPES *)(local_30 + 1);
          test_case.m_type.m_n_columns._0_1_ = test_case.m_stage._3_1_ & 1;
          test_case.m_type.m_n_rows = test_case._16_4_;
          std::
          vector<gl4cts::EnhancedLayouts::UniformBlockMemberAlignNonPowerOf2Test::testCase,_std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberAlignNonPowerOf2Test::testCase>_>
          ::push_back(&this->m_test_cases,(value_type *)local_74);
        }
      }
    }
  }
  return;
}

Assistant:

void UniformBlockMemberAlignNonPowerOf2Test::testInit()
{
	static const GLuint dmat4_size = 128;
	const GLuint		n_types	= getTypesNumber();
	bool				stage_support[Utils::Shader::STAGE_MAX];

	for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
	{
		stage_support[stage] = isStageSupported((Utils::Shader::STAGES)stage);
	}

	for (GLuint j = 0; j < n_types; ++j)
	{
		const Utils::Type& type = getType(j);

		for (GLuint align = 0; align <= dmat4_size; ++align)
		{

#if WRKARD_UNIFORMBLOCKMEMBERALIGNNONPOWEROF2TEST

			const bool should_fail = (0 == align) ? false : !isPowerOf2(align);

#else /* WRKARD_UNIFORMBLOCKMEMBERALIGNNONPOWEROF2TEST */

			const bool should_fail = !isPowerOf2(align);

#endif /* WRKARD_UNIFORMBLOCKMEMBERALIGNNONPOWEROF2TEST */

			for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
			{
				if (false == stage_support[stage])
				{
					continue;
				}

				testCase test_case = { align, type, should_fail, (Utils::Shader::STAGES)stage };

				m_test_cases.push_back(test_case);
			}
		}
	}
}